

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
::Chain_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
           *this,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *orderedBoundaries,Column_settings *colSettings)

{
  ID_index cellID;
  pointer pvVar1;
  pointer puVar2;
  pointer puVar3;
  undefined8 *puVar4;
  long lVar5;
  ulong uVar6;
  uint dimension;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *b;
  pointer boundary;
  __hashtable *__this;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined4 *)(this + 0x18) = 0xffffffff;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  puVar4 = (undefined8 *)operator_new(0x30);
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[5] = 0;
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[3] = puVar4 + 1;
  puVar4[4] = puVar4 + 1;
  puVar4[5] = 0;
  *(undefined8 **)(this + 0x50) = puVar4;
  *(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
    **)(this + 0x58) = this + 0x88;
  *(undefined8 *)(this + 0x60) = 1;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined4 *)(this + 0x78) = 0x3f800000;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
    **)(this + 0x90) = this + 0xc0;
  *(undefined8 *)(this + 0x98) = 1;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined4 *)(this + 0xb0) = 0x3f800000;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined4 *)(this + 200) = 0;
  *(Column_settings **)(this + 0xd0) = colSettings;
  lVar5 = ((long)(orderedBoundaries->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(orderedBoundaries->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar7._0_8_ = lVar5;
  auVar7._12_4_ = 0x45300000;
  dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  uVar6 = (ulong)dVar8;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)(this + 0x58),(long)(dVar8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
  lVar5 = ((long)(orderedBoundaries->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(orderedBoundaries->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar9._0_8_ = lVar5;
  auVar9._12_4_ = 0x45300000;
  dVar8 = ceil(((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
               (double)*(float *)(this + 0xb0));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)(this + 0x90),
           (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8);
  boundary = (orderedBoundaries->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (orderedBoundaries->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (boundary != pvVar1) {
    do {
      puVar2 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      cellID = *(ID_index *)(this + 200);
      dimension = (int)((ulong)((long)puVar2 - (long)puVar3) >> 2) - 1;
      if (puVar2 == puVar3) {
        dimension = 0;
      }
      Matrix_all_dimension_holder<int>::update_up
                ((Matrix_all_dimension_holder<int> *)this,dimension);
      _reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                (&local_48,this,cellID,boundary,-1);
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      boundary = boundary + 1;
    } while (boundary != pvVar1);
  }
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(const std::vector<Boundary_range>& orderedBoundaries,
                                                 Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Pair_opt(),
      Swap_opt(),
      Rep_opt(),
      RA_opt(orderedBoundaries.size()),
      nextIndex_(0),
      colSettings_(colSettings)
{
  matrix_.reserve(orderedBoundaries.size());
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(orderedBoundaries.size());
  } else {
    pivotToColumnIndex_.resize(orderedBoundaries.size(), Master_matrix::template get_null_value<Index>());
  }

  for (const Boundary_range& b : orderedBoundaries) {
    insert_boundary(b);
  }
}